

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create.cpp
# Opt level: O0

bool __thiscall create::Create::driveRadius(Create *this,float *vel,float *radius)

{
  element_type *this_00;
  ssize_t sVar1;
  size_t in_RCX;
  int in_R8D;
  float fVar2;
  float fVar3;
  float local_58;
  float local_54;
  float local_4c;
  float local_44;
  undefined1 local_2d;
  undefined1 local_2c;
  undefined1 local_2b;
  undefined1 local_2a;
  undefined1 local_29;
  short local_28;
  undefined1 uStack_26;
  uint8_t cmd [5];
  int16_t radius_mm;
  int16_t vel_mm;
  float boundedVel;
  float *radius_local;
  float *vel_local;
  Create *this_local;
  
  fVar3 = *vel;
  fVar2 = RobotModel::getMaxVelocity(&this->model);
  if (-fVar2 <= fVar3) {
    fVar3 = *vel;
    fVar2 = RobotModel::getMaxVelocity(&this->model);
    if (fVar3 <= fVar2) {
      local_4c = *vel;
    }
    else {
      local_4c = RobotModel::getMaxVelocity(&this->model);
    }
    local_44 = local_4c;
  }
  else {
    local_44 = RobotModel::getMaxVelocity(&this->model);
    local_44 = -local_44;
  }
  cmd._1_4_ = local_44;
  fVar3 = roundf(local_44 * 1000.0);
  _uStack_26 = (undefined2)(int)fVar3;
  fVar3 = roundf(*radius * 1000.0);
  local_28 = (short)(int)fVar3;
  if ((((local_28 != -0x8000) && (local_28 != 0x7fff)) && (local_28 != -1)) && (local_28 != 1)) {
    if (-2000.0 <= (float)(int)local_28) {
      if ((float)(int)local_28 <= 2000.0) {
        local_58 = (float)(int)local_28;
      }
      else {
        local_58 = 2000.0;
      }
      local_54 = local_58;
    }
    else {
      local_54 = -2000.0;
    }
    local_28 = (short)(int)local_54;
  }
  local_2d = 0x89;
  local_2c = (undefined1)((ushort)_uStack_26 >> 8);
  local_2b = (undefined1)_uStack_26;
  local_2a = (undefined1)((ushort)local_28 >> 8);
  local_29 = (undefined1)local_28;
  this_00 = std::__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<create::Serial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->serial);
  sVar1 = Serial::send(this_00,(int)&local_2d,(void *)0x5,in_RCX,in_R8D);
  return (bool)((byte)sVar1 & 1);
}

Assistant:

bool Create::driveRadius(const float& vel, const float& radius) {
    // Bound velocity
    float boundedVel = BOUND_CONST(vel, -model.getMaxVelocity(), model.getMaxVelocity());

    // Expects each parameter as two bytes each and in millimeters
    int16_t vel_mm = roundf(boundedVel * 1000);
    int16_t radius_mm = roundf(radius * 1000);

    // Bound radius if not a special case
    if (radius_mm != -32768 && radius_mm != 32767 &&
        radius_mm != -1 && radius_mm != 1) {
      BOUND(radius_mm, -util::MAX_RADIUS * 1000, util::MAX_RADIUS * 1000);
    }

    uint8_t cmd[5] = { OC_DRIVE,
                       static_cast<uint8_t>(vel_mm >> 8),
                       static_cast<uint8_t>(vel_mm & 0xff),
                       static_cast<uint8_t>(radius_mm >> 8),
                       static_cast<uint8_t>(radius_mm & 0xff)
                     };

    return serial->send(cmd, 5);
  }